

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_stream.c
# Opt level: O3

int log_aspect_stream_impl_write_cb
              (log_aspect aspect,log_policy policy,log_aspect_notify_data notify_data)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  log_aspect aspect_00;
  undefined8 *puVar4;
  size_t __size;
  void *__ptr;
  
  puVar3 = (undefined8 *)log_policy_derived(policy);
  aspect_00 = log_impl_aspect(*notify_data,LOG_ASPECT_FORMAT);
  puVar4 = (undefined8 *)log_aspect_derived(aspect_00);
  __size = (*(code *)*puVar4)(aspect_00,*(undefined8 *)((long)notify_data + 8));
  iVar2 = 1;
  if (__size != 0) {
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      iVar1 = (*(code *)puVar4[1])(aspect_00,*(undefined8 *)((long)notify_data + 8),__ptr,__size);
      iVar2 = 1;
      if (iVar1 == 0) {
        iVar1 = (*(code *)*puVar3)(policy,__ptr,__size);
        if (iVar1 == 0) {
          iVar2 = (*(code *)puVar3[1])(policy);
        }
      }
      free(__ptr);
    }
  }
  return iVar2;
}

Assistant:

static int log_aspect_stream_impl_write_cb(log_aspect aspect, log_policy policy, log_aspect_notify_data notify_data)
{
	log_aspect_stream_write_cb_data write_args = notify_data;

	log_policy_stream_impl stream_impl = log_policy_derived(policy);

	log_aspect format = log_impl_aspect(write_args->impl, LOG_ASPECT_FORMAT);

	log_aspect_format_impl format_impl = log_aspect_derived(format);

	size_t size = format_impl->size(format, write_args->record);

	(void)aspect;

	if (size == 0)
	{
		return 1;
	}

	/* TODO: remove this, use storage policy instead */
	{
		void *buffer = malloc(size);

		int result = 1;

		if (buffer == NULL)
		{
			return 1;
		}

		if (format_impl->serialize(format, write_args->record, buffer, size) != 0)
		{
			free(buffer);

			return 1;
		}

		if (stream_impl->write(policy, buffer, size) == 0)
		{
			result = stream_impl->flush(policy);
		}

		free(buffer);

		return result;
	}
}